

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_binning_array_unaligned.h
# Opt level: O2

LinearSpace3fa * __thiscall
embree::sse2::UnalignedHeuristicArrayBinningMB<embree::PrimRefMB,_32UL>::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,
          UnalignedHeuristicArrayBinningMB<embree::PrimRefMB,_32UL> *this,Scene *scene,SetMB *set)

{
  uint uVar1;
  uint uVar2;
  PrimRefMB *pPVar3;
  Geometry *pGVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  unsigned_long uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar20;
  float fVar21;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  undefined1 auVar22 [12];
  float fVar24;
  float fVar25;
  undefined1 auVar23 [16];
  float fVar26;
  vfloat4 a;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  Vec3fa axis1;
  
  uVar9 = (set->super_PrimInfoMB).object_range._begin;
  lVar11 = uVar9 * 0x50 + 0x1c;
  uVar10 = 0xffffffffffffffff;
  local_68 = 0.0;
  fStack_64 = 0.0;
  fStack_60 = 1.0;
  fStack_5c = 0.0;
  for (; uVar9 < (set->super_PrimInfoMB).object_range._end; uVar9 = uVar9 + 1) {
    pPVar3 = set->prims->items;
    uVar1 = *(uint *)((long)pPVar3 + lVar11 + -0x10);
    uVar2 = *(uint *)((long)&(pPVar3->lbounds).bounds0.lower.field_0 + lVar11);
    uVar12 = CONCAT44(uVar2,uVar1);
    if (uVar12 < uVar10) {
      pGVar4 = (scene->geometries).items[uVar1].ptr;
      fVar20 = (pGVar4->time_range).lower;
      fVar15 = pGVar4->fnumTimeSegments;
      fVar14 = (set->super_PrimInfoMB).time_range.upper;
      fVar16 = (pGVar4->time_range).upper - fVar20;
      fVar13 = floorf((((set->super_PrimInfoMB).time_range.lower - fVar20) / fVar16) * 1.0000002 *
                      fVar15);
      fVar21 = 0.0;
      if (0.0 <= fVar13) {
        fVar21 = fVar13;
      }
      fVar14 = ceilf(((fVar14 - fVar20) / fVar16) * 0.99999976 * fVar15);
      if (fVar15 <= fVar14) {
        fVar14 = fVar15;
      }
      if ((int)fVar14 != (int)fVar21) {
        (*(pGVar4->super_RefCount)._vptr_RefCount[0x38])
                  (&axis1,pGVar4,(ulong)uVar2,(long)(((int)fVar14 + (int)fVar21) / 2));
        fVar20 = axis1.field_0.m128[1] * axis1.field_0.m128[1];
        fVar21 = axis1.field_0.m128[2] * axis1.field_0.m128[2];
        fVar13 = axis1.field_0.m128[3] * axis1.field_0.m128[3];
        fVar15 = fVar20 + axis1.field_0.m128[0] * axis1.field_0.m128[0] + fVar21;
        fVar14 = fVar20 + fVar20 + fVar13;
        fVar21 = fVar20 + fVar21 + fVar21;
        fVar13 = fVar20 + fVar13 + fVar13;
        if (1e-18 < fVar15) {
          auVar17._4_4_ = fVar14;
          auVar17._0_4_ = fVar15;
          auVar17._8_4_ = fVar21;
          auVar17._12_4_ = fVar13;
          auVar18._4_4_ = fVar14;
          auVar18._0_4_ = fVar15;
          auVar18._8_4_ = fVar21;
          auVar18._12_4_ = fVar13;
          auVar18 = rsqrtss(auVar17,auVar18);
          fVar14 = auVar18._0_4_;
          fStack_5c = fVar14 * fVar14 * fVar15 * -0.5 * fVar14 + fVar14 * 1.5;
          local_68 = axis1.field_0.m128[0] * fStack_5c;
          fStack_64 = axis1.field_0.m128[1] * fStack_5c;
          fStack_60 = axis1.field_0.m128[2] * fStack_5c;
          fStack_5c = axis1.field_0.m128[3] * fStack_5c;
          uVar10 = uVar12;
        }
      }
    }
    lVar11 = lVar11 + 0x50;
  }
  fVar14 = -fStack_64;
  fVar15 = -fStack_60;
  auVar22._8_4_ = 0xffffffff;
  auVar22._0_8_ = 0xffffffffffffffff;
  if (fVar14 * fVar14 + fStack_60 * fStack_60 + 0.0 <= local_68 * local_68 + fVar15 * fVar15 + 0.0)
  {
    auVar22 = SUB1612((undefined1  [16])0x0,0);
  }
  fVar21 = (float)((uint)fStack_60 & auVar22._4_4_);
  fVar15 = (float)(~auVar22._0_4_ & (uint)fVar15);
  fVar20 = (float)(~auVar22._8_4_ & (uint)local_68 | (uint)fVar14 & auVar22._8_4_);
  fVar14 = fVar21 * fVar21;
  fVar13 = fVar20 * fVar20;
  fVar16 = fVar14 + fVar15 * fVar15 + fVar13;
  fVar26 = fVar14 + fVar14 + 0.0;
  fVar13 = fVar14 + fVar13 + fVar13;
  fVar14 = fVar14 + 0.0 + 0.0;
  auVar27._4_4_ = fVar26;
  auVar27._0_4_ = fVar16;
  auVar27._8_4_ = fVar13;
  auVar27._12_4_ = fVar14;
  auVar7._4_4_ = fVar26;
  auVar7._0_4_ = fVar16;
  auVar7._8_4_ = fVar13;
  auVar7._12_4_ = fVar14;
  auVar18 = rsqrtss(auVar27,auVar7);
  fVar14 = auVar18._0_4_;
  fVar14 = fVar14 * 1.5 - fVar14 * fVar14 * fVar16 * 0.5 * fVar14;
  fVar15 = fVar14 * fVar15;
  fVar21 = fVar14 * fVar21;
  fVar20 = fVar14 * fVar20;
  fVar13 = fVar21 * local_68 - fStack_64 * fVar15;
  fVar16 = fVar20 * fStack_64 - fStack_60 * fVar21;
  fVar26 = fVar15 * fStack_60 - local_68 * fVar20;
  fVar25 = fVar14 * 0.0 * fStack_5c - fStack_5c * fVar14 * 0.0;
  fVar14 = fVar16 * fVar16;
  fVar24 = fVar26 * fVar26;
  fVar25 = fVar25 * fVar25;
  fVar28 = fVar24 + fVar14 + fVar13 * fVar13;
  fVar29 = fVar25 + fVar14 + fVar14;
  fVar24 = fVar24 + fVar14 + fVar24;
  fVar25 = fVar25 + fVar14 + fVar25;
  auVar23._4_4_ = fVar29;
  auVar23._0_4_ = fVar28;
  auVar23._8_4_ = fVar24;
  auVar23._12_4_ = fVar25;
  auVar8._4_4_ = fVar29;
  auVar8._0_4_ = fVar28;
  auVar8._8_4_ = fVar24;
  auVar8._12_4_ = fVar25;
  auVar18 = rsqrtss(auVar23,auVar8);
  fVar14 = auVar18._0_4_;
  fVar14 = fVar14 * 1.5 - fVar14 * fVar14 * fVar28 * 0.5 * fVar14;
  aVar19.m128[1] = fVar14 * fVar26;
  aVar19.m128[0] = fVar21;
  aVar19.m128[2] = fStack_64;
  aVar19.m128[3] = 0.0;
  aVar5.m128[1] = fVar14 * fVar16;
  aVar5.m128[0] = fVar15;
  aVar5.m128[2] = local_68;
  aVar5.m128[3] = 0.0;
  (__return_storage_ptr__->vx).field_0 = aVar5;
  (__return_storage_ptr__->vy).field_0 = aVar19;
  aVar6.m128[1] = fVar14 * fVar13;
  aVar6.m128[0] = fVar20;
  aVar6.m128[2] = fStack_60;
  aVar6.m128[3] = 0.0;
  (__return_storage_ptr__->vz).field_0 = aVar6;
  return __return_storage_ptr__;
}

Assistant:

const LinearSpace3fa computeAlignedSpaceMB(Scene* scene, const SetMB& set)
        {
          Vec3fa axis0(0,0,1);
          uint64_t bestGeomPrimID = -1;

          /*! find curve with minimum ID that defines valid direction */
          for (size_t i=set.begin(); i<set.end(); i++)
          {
            const PrimRefMB& prim = (*set.prims)[i];
            const unsigned int geomID = prim.geomID();
            const unsigned int primID = prim.primID();
            const uint64_t geomprimID = prim.ID64();
            if (geomprimID >= bestGeomPrimID) continue;
            
            const Geometry* mesh = scene->get(geomID);
            const range<int> tbounds = mesh->timeSegmentRange(set.time_range);
            if (tbounds.size() == 0) continue;

            const size_t t = (tbounds.begin()+tbounds.end())/2;
            const Vec3fa axis1 = mesh->computeDirection(primID,t);
            if (sqr_length(axis1) > 1E-18f) {
              axis0 = normalize(axis1);
              bestGeomPrimID = geomprimID;
            }
          }

          return frame(axis0).transposed();
        }